

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-netlink.c
# Opt level: O1

int rops_pt_init_destroy_netlink
              (lws_context *context,lws_context_creation_info *info,lws_context_per_thread *pt,
              int destroy)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  lws_log_cx *plVar4;
  lws *wsi;
  ssize_t sVar5;
  int *piVar6;
  sockaddr_nl sanl;
  iovec iov;
  nl_req_s req;
  msghdr msg;
  sockaddr local_a8;
  iovec local_98;
  ulong local_88;
  undefined4 uStack_80;
  __pid_t _Stack_7c;
  undefined4 local_78;
  undefined8 local_74;
  msghdr local_68;
  
  if (destroy == 0) {
    iVar1 = 0;
    if ((context->netlink == (lws *)0x0) && (pt <= context->pt)) {
      plVar4 = lwsl_context_get_cx(context);
      _lws_log_cx(plVar4,lws_log_prepend_context,context,8,"rops_pt_init_destroy_netlink",
                  "creating netlink skt");
      wsi = __lws_wsi_create_with_role
                      (context,(int)((ulong)((long)pt - (long)context->pt) >> 5) * -0x3b13b13b,
                       &role_ops_netlink,(lws_log_cx_t *)0x0);
      if (wsi == (lws *)0x0) {
        iVar1 = 1;
      }
      else {
        iVar1 = socket(0x10,3,0);
        (wsi->desc).sockfd = iVar1;
        if (iVar1 == -1) {
          plVar4 = lwsl_context_get_cx(context);
          iVar1 = 1;
          _lws_log_cx(plVar4,lws_log_prepend_context,context,1,"rops_pt_init_destroy_netlink",
                      "unable to open netlink");
        }
        else {
          lws_plat_set_nonblocking(iVar1);
          iVar1 = 0;
          __lws_lc_tag(context,context->lcg + 1,&wsi->lc,"netlink");
          local_a8.sa_data[6] = '\0';
          local_a8.sa_data[7] = '\0';
          local_a8.sa_data[8] = '\0';
          local_a8.sa_data[9] = '\0';
          local_a8.sa_family = 0x10;
          local_a8.sa_data[0] = '\0';
          local_a8.sa_data[1] = '\0';
          local_a8.sa_data[2] = '\0';
          local_a8.sa_data[3] = '\0';
          local_a8.sa_data[4] = '\0';
          local_a8.sa_data[5] = '\0';
          _Var2 = getpid();
          local_a8.sa_data._2_4_ = _Var2;
          local_a8.sa_data[6] = 'Q';
          local_a8.sa_data[7] = '\0';
          local_a8.sa_data[8] = '\0';
          local_a8.sa_data[9] = '\0';
          iVar3 = bind((wsi->desc).sockfd,&local_a8,0xc);
          if (iVar3 < 0) {
            plVar4 = lwsl_context_get_cx(context);
            _lws_log_cx(plVar4,lws_log_prepend_context,context,2,"rops_pt_init_destroy_netlink",
                        "netlink bind failed");
          }
          else {
            context->netlink = wsi;
            iVar3 = lws_wsi_inject_to_loop(pt,wsi);
            iVar1 = 1;
            if (iVar3 == 0) {
              local_a8.sa_data[6] = '\0';
              local_a8.sa_data[7] = '\0';
              local_a8.sa_data[8] = '\0';
              local_a8.sa_data[9] = '\0';
              local_68.msg_name = (void *)0x0;
              local_68.msg_namelen = 0;
              local_68._12_4_ = 0;
              local_68.msg_iov = (iovec *)0x0;
              local_68.msg_iovlen = 0;
              local_68.msg_control = (void *)0x0;
              local_68.msg_controllen = 0;
              local_68.msg_flags = 0;
              local_68._52_4_ = 0;
              _Stack_7c = 0;
              local_78 = 0;
              local_74 = 0;
              local_a8.sa_family = 0x10;
              local_a8.sa_data[0] = '\0';
              local_a8.sa_data[1] = '\0';
              local_a8.sa_data[2] = '\0';
              local_a8.sa_data[3] = '\0';
              local_a8.sa_data[4] = '\0';
              local_a8.sa_data[5] = '\0';
              local_88 = 0x301001a0000001c;
              uStack_80 = 1;
              _Stack_7c = getpid();
              local_78 = CONCAT31(local_78._1_3_,0x11);
              local_74 = CONCAT71(local_74._1_7_,0xfd);
              local_68.msg_iov = &local_98;
              local_98.iov_len = local_88 & 0xffffffff;
              local_68.msg_iovlen = 1;
              local_68.msg_namelen = 0xc;
              local_98.iov_base = &local_88;
              local_68.msg_name = &local_a8;
              sVar5 = sendmsg((wsi->desc).sockfd,&local_68,0);
              if ((int)sVar5 < 0) {
                plVar4 = lwsl_context_get_cx(context);
                piVar6 = __errno_location();
                _lws_log_cx(plVar4,lws_log_prepend_context,context,4,"rops_pt_init_destroy_netlink",
                            "rt dump req failed... permissions? errno %d",*piVar6);
              }
              plVar4 = lwsl_context_get_cx(context);
              _lws_log_cx(plVar4,lws_log_prepend_context,context,0x10,"rops_pt_init_destroy_netlink"
                          ,"starting netlink coldplug wait");
              return 0;
            }
          }
          __lws_lc_untag((wsi->a).context,&wsi->lc);
          close((wsi->desc).sockfd);
        }
        lws_realloc(wsi,0,"lws_free");
      }
    }
  }
  else {
    _lws_route_table_empty(pt);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
rops_pt_init_destroy_netlink(struct lws_context *context,
			     const struct lws_context_creation_info *info,
			     struct lws_context_per_thread *pt, int destroy)
{
	struct sockaddr_nl sanl;
	struct nl_req_s req;
	struct msghdr msg;
	struct iovec iov;
	struct lws *wsi;
	int n, ret = 1;

	if (destroy) {

		/*
		 * pt netlink wsi closed + freed as part of pt's destroy
		 * wsi mass close, just need to take down the routing table
		 */
		_lws_route_table_empty(pt);

		return 0;
	}

	if (context->netlink)
		return 0;

	if (pt > &context->pt[0])
		/* we can only have one netlink socket */
		return 0;

	lwsl_cx_info(context, "creating netlink skt");

	/*
	 * We want a netlink socket per pt as well
	 */

	lws_context_lock(context, __func__);
	wsi = __lws_wsi_create_with_role(context, (int)(pt - &context->pt[0]),
				       &role_ops_netlink, NULL);
	lws_context_unlock(context);
	if (!wsi)
		goto bail;

	wsi->desc.sockfd = socket(AF_NETLINK, SOCK_RAW, NETLINK_ROUTE);
	if (wsi->desc.sockfd == LWS_SOCK_INVALID) {
		lwsl_cx_err(context, "unable to open netlink");
		goto bail1;
	}

	lws_plat_set_nonblocking(wsi->desc.sockfd);

	__lws_lc_tag(context, &context->lcg[LWSLCG_VHOST], &wsi->lc,
			"netlink");

	memset(&sanl, 0, sizeof(sanl));
	sanl.nl_family		= AF_NETLINK;
	sanl.nl_pid		= (uint32_t)getpid();
	sanl.nl_groups		= (1 << (RTNLGRP_LINK - 1)) |
				  (1 << (RTNLGRP_IPV4_ROUTE - 1)) |
				  (1 << (RTNLGRP_IPV4_IFADDR - 1))
#if defined(LWS_WITH_IPV6)
				  | (1 << (RTNLGRP_IPV6_ROUTE - 1)) |
				    (1 << (RTNLGRP_IPV6_IFADDR - 1))
#endif
				 ;

	if (lws_fi(&context->fic, "netlink_bind") ||
	    bind(wsi->desc.sockfd, (struct sockaddr*)&sanl, sizeof(sanl)) < 0) {
		lwsl_cx_warn(context, "netlink bind failed");
		ret = 0; /* some systems deny access, just ignore */
		goto bail2;
	}

	context->netlink = wsi;
	if (lws_wsi_inject_to_loop(pt, wsi))
		goto bail2;

/*	if (lws_change_pollfd(wsi, 0, LWS_POLLIN)) {
		lwsl_err("%s: pollfd in fail\n", __func__);
		goto bail2;
	}
*/
	/*
	 * Since we're starting the PT, ask to be sent all the existing routes.
	 *
	 * This requires CAP_ADMIN, or root... we do this early before dropping
	 * privs
	 */

	memset(&sanl, 0, sizeof(sanl));
	memset(&msg, 0, sizeof(msg));
	memset(&req, 0, sizeof(req));

	sanl.nl_family		= AF_NETLINK;

	req.hdr.nlmsg_len	= NLMSG_LENGTH(sizeof(req.gen));
	req.hdr.nlmsg_type	= RTM_GETROUTE;
	req.hdr.nlmsg_flags	= NLM_F_REQUEST | NLM_F_DUMP;
	req.hdr.nlmsg_seq	= 1;
	req.hdr.nlmsg_pid	= (uint32_t)getpid();
	req.gen.rtm_family	= AF_PACKET;
	req.gen.rtm_table	= RT_TABLE_DEFAULT;

	iov.iov_base		= &req;
	iov.iov_len		= req.hdr.nlmsg_len;
	msg.msg_iov		= &iov;
	msg.msg_iovlen		= 1;
	msg.msg_name		= &sanl;
	msg.msg_namelen		= sizeof(sanl);

	n = (int)sendmsg(wsi->desc.sockfd, (struct msghdr *)&msg, 0);
	if (n < 0) {
		lwsl_cx_notice(context, "rt dump req failed... permissions? errno %d",
				LWS_ERRNO);
	}

	/*
	 * Responses are going to come asynchronously, let's block moving
	 * off state IFACE_COLDPLUG until we have had them.  This is important
	 * since if we don't hold there, when we do get the responses we may
	 * cull any ongoing connections as unroutable otherwise
	 */

	lwsl_cx_debug(context, "starting netlink coldplug wait");

	return 0;

bail2:
	__lws_lc_untag(wsi->a.context, &wsi->lc);
	compatible_close(wsi->desc.sockfd);
bail1:
	lws_free(wsi);
bail:
	return ret;
}